

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestPath.cpp
# Opt level: O0

void __thiscall CppUnit::TestPath::removeTest(TestPath *this,int index)

{
  iterator local_98;
  iterator local_78;
  _Self local_58;
  const_iterator local_38;
  int local_14;
  TestPath *pTStack_10;
  int index_local;
  TestPath *this_local;
  
  local_14 = index;
  pTStack_10 = this;
  checkIndexValid(this,index);
  std::deque<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>::begin(&local_78,&this->m_tests);
  std::operator+(&local_58,&local_78,(long)local_14);
  std::_Deque_iterator<CppUnit::Test*,CppUnit::Test*const&,CppUnit::Test*const*>::
  _Deque_iterator<std::_Deque_iterator<CppUnit::Test*,CppUnit::Test*&,CppUnit::Test**>,void>
            ((_Deque_iterator<CppUnit::Test*,CppUnit::Test*const&,CppUnit::Test*const*> *)&local_38,
             &local_58);
  std::deque<CppUnit::Test_*,_std::allocator<CppUnit::Test_*>_>::erase
            (&local_98,&this->m_tests,&local_38);
  return;
}

Assistant:

void 
TestPath::removeTest( int index )
{
  checkIndexValid( index );
  m_tests.erase( m_tests.begin() + index );
}